

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O2

int ExorLinkCubeIteratorNext(Cube **pGroup)

{
  int iVar1;
  Cube *pCVar2;
  Cube *pCVar3;
  int iVar4;
  Cube *pCVar5;
  drow *pdVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int (*paiVar15) [3];
  long lVar16;
  long lVar17;
  
  if (fWorking == '\0') {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x237,"int ExorLinkCubeIteratorNext(Cube **)");
  }
  iVar4 = 0;
  if (nVisitedGroups != nGroups) {
    uVar8 = 0;
    uVar13 = (ulong)(uint)nGroups;
    if (nGroups < 1) {
      uVar13 = uVar8;
    }
    iVar4 = -1;
    for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
      if (((*(uint *)((long)s_BitMasks + uVar8) & VisitedGroups) == 0) &&
         (iVar4 < *(int *)((long)GroupCosts + uVar8))) {
        GroupCostBestNum = (int)uVar14;
        iVar4 = *(int *)((long)GroupCosts + uVar8);
      }
      uVar8 = uVar8 + 4;
    }
    if (iVar4 == -1) {
      __assert_fail("GroupCostBest != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                    ,0x255,"int ExorLinkCubeIteratorNext(Cube **)");
    }
    LastGroup = 0;
    iVar4 = nCubes;
    for (lVar17 = 0; lVar17 < iVar4; lVar17 = lVar17 + 1) {
      CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][lVar17];
      LastGroup = LastGroup | s_BitMasks[CubeNum];
      pCVar5 = ELCubes[CubeNum];
      if (pCVar5 == (Cube *)0x0) {
        pCVar5 = GetFreeCube();
        lVar9 = (long)CubeNum;
        ELCubes[lVar9] = pCVar5;
        pdVar6 = DammyBitData;
        for (lVar12 = 0; uVar11 = nDiffVarsIn, pCVar3 = pCB, pCVar2 = pCA,
            lVar12 < g_CoverInfo.nWordsIn; lVar12 = lVar12 + 1) {
          pCVar5->pCubeDataIn[lVar12] = *pdVar6;
          pdVar6 = pdVar6 + 1;
        }
        NewZ = 0;
        if (DiffVars[0] < 0) {
          lVar12 = (long)nDist;
          iVar4 = s_ELCubeRules[lVar12][lVar9][nDiffVarsIn];
          if (iVar4 == 0) {
            for (lVar16 = 0; lVar16 < g_CoverInfo.nWordsOut; lVar16 = lVar16 + 1) {
              uVar10 = pCVar2->pCubeDataOut[lVar16];
              pCVar5->pCubeDataOut[lVar16] = uVar10;
              NewZ = NewZ + (uint)BitCount[uVar10 >> 0x10] + (uint)BitCount[uVar10 & 0xffff];
            }
          }
          else if (iVar4 == 1) {
            for (lVar16 = 0; lVar16 < g_CoverInfo.nWordsOut; lVar16 = lVar16 + 1) {
              uVar10 = pCVar3->pCubeDataOut[lVar16];
              pCVar5->pCubeDataOut[lVar16] = uVar10;
              NewZ = NewZ + (uint)BitCount[uVar10 >> 0x10] + (uint)BitCount[uVar10 & 0xffff];
            }
          }
          else if (iVar4 == 2) {
            for (lVar16 = 0; lVar16 < g_CoverInfo.nWordsOut; lVar16 = lVar16 + 1) {
              uVar10 = pCVar3->pCubeDataOut[lVar16] ^ pCVar2->pCubeDataOut[lVar16];
              pCVar5->pCubeDataOut[lVar16] = uVar10;
              NewZ = NewZ + (uint)BitCount[uVar10 >> 0x10] + (uint)BitCount[uVar10 & 0xffff];
            }
          }
        }
        else {
          for (lVar12 = 0; lVar12 < g_CoverInfo.nWordsOut; lVar12 = lVar12 + 1) {
            pCVar5->pCubeDataOut[lVar12] = pCVar2->pCubeDataOut[lVar12];
          }
          NewZ = (int)pCVar2->z;
          lVar12 = (long)nDist;
          uVar11 = nDiffVarsIn;
        }
        iVar4 = NewZ;
        uVar13 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar13 = 0;
        }
        paiVar15 = DiffVarValues;
        for (lVar16 = 0; uVar13 * 4 != lVar16; lVar16 = lVar16 + 4) {
          pCVar5->pCubeDataIn[*(int *)((long)DiffVarWords + lVar16)] =
               pCVar5->pCubeDataIn[*(int *)((long)DiffVarWords + lVar16)] |
               (*paiVar15)[*(int *)((long)s_ELCubeRules[lVar12][lVar9] + lVar16)] <<
               (*(byte *)((long)DiffVarBits + lVar16) & 0x1f);
          paiVar15 = paiVar15 + 1;
        }
        pCVar5->a = (short)CubeLiterals[lVar9] + (short)StartingLiterals;
        pCVar5->z = (short)iVar4;
        iVar4 = ComputeQCostBits(pCVar5);
        pCVar5 = ELCubes[CubeNum];
        pCVar5->q = (short)iVar4;
        iVar4 = nCubes;
        if (NewZ == 0xff) {
          __assert_fail("NewZ != 255",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                        ,0x295,"int ExorLinkCubeIteratorNext(Cube **)");
        }
        iVar1 = g_CoverInfo.cIDs + 1;
        bVar7 = (byte)g_CoverInfo.cIDs;
        g_CoverInfo.cIDs = iVar1;
        pCVar5->ID = bVar7;
        if (iVar1 == 0x100) {
          g_CoverInfo.cIDs = 1;
        }
      }
      pGroup[lVar17] = pCVar5;
    }
    VisitedGroups = VisitedGroups | s_BitMasks[GroupCostBestNum];
    lVar17 = (long)nVisitedGroups;
    nVisitedGroups = nVisitedGroups + 1;
    GroupOrder[lVar17] = GroupCostBestNum;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int ExorLinkCubeIteratorNext( Cube** pGroup )
// give the next group in the decreasing order of sum of literals
// returns 1 on success, returns 0 if there are no more groups
{
    int i, c;

    // check that everything is okey
    assert( fWorking );

    if ( nVisitedGroups == nGroups ) 
    // we have iterated through all groups
        return 0;

    // find the min/max cost group
    if ( fMinLitGroupsFirst[nDist] ) 
//  if ( nCubes == 4 ) 
    { // find the minimum cost
        // go through all groups
        GroupCostBest = LARGE_NUM;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest > GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != LARGE_NUM );
    }
    else 
    { // find the maximum cost
        // go through all groups
        GroupCostBest = -1;
        for ( i = 0; i < nGroups; i++ )
            if ( !(VisitedGroups & s_BitMasks[i]) && GroupCostBest < GroupCosts[i] )
            {
                GroupCostBest = GroupCosts[i];
                GroupCostBestNum = i;
            }
        assert( GroupCostBest != -1 );
    }

    // create the cubes needed for the group, if they are not created already
    LastGroup = 0;
    for ( c = 0; c < nCubes; c++ )
    {
        CubeNum = s_ELGroupRules[nDist][GroupCostBestNum][c];
        LastGroup |= s_BitMasks[CubeNum];

        if ( ELCubes[CubeNum] == NULL ) // this cube does not exist
        {
            // bring a cube from the free cube list
            ELCubes[CubeNum] = GetFreeCube();

            // copy the input bit data into the cube 
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                ELCubes[CubeNum]->pCubeDataIn[i] = DammyBitData[i];

            // copy the output bit data into the cube
            NewZ = 0;
            if ( DiffVars[0] >= 0 ) // the output is not involved in ExorLink
            {
                for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    ELCubes[CubeNum]->pCubeDataOut[i] = pCA->pCubeDataOut[i];
                NewZ = pCA->z;
            }
            else // the output is involved
            { // determine where the output information comes from
                Value = s_ELCubeRules[nDist][CubeNum][nDiffVarsIn];
                if ( Value == vs0 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vs1 )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
                else if ( Value == vsX )
                    for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                    {
                        Temp = pCA->pCubeDataOut[i] ^ pCB->pCubeDataOut[i];
                        ELCubes[CubeNum]->pCubeDataOut[i] = Temp;
                        NewZ += BIT_COUNT(Temp);
                    }
            }

            // set the variables that should be there
            for ( i = 0; i < nDiffVarsIn; i++ )
            {
                Value = DiffVarValues[i][ s_ELCubeRules[nDist][CubeNum][i] ];
                ELCubes[CubeNum]->pCubeDataIn[ DiffVarWords[i] ] |= ( Value << DiffVarBits[i] );
            }

            // set the number of literals and output ones
            ELCubes[CubeNum]->a = StartingLiterals + CubeLiterals[CubeNum];
            ELCubes[CubeNum]->z = NewZ;
            ELCubes[CubeNum]->q = ComputeQCostBits( ELCubes[CubeNum] );
            assert( NewZ != 255 );

            // assign the ID
            ELCubes[CubeNum]->ID = g_CoverInfo.cIDs++;
            // skip through zero-ID
            if ( g_CoverInfo.cIDs == 256 )
                g_CoverInfo.cIDs = 1;

        }
        // prepare the return array
        pGroup[c] = ELCubes[CubeNum];
    }

    // mark this group as visited 
    VisitedGroups |= s_BitMasks[ GroupCostBestNum ];
    // set the next visited group number and
    // increment the counter of visited groups
    GroupOrder[ nVisitedGroups++ ] = GroupCostBestNum;
    return 1;
}